

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * actionName(u8 action)

{
  char *zName;
  u8 action_local;
  
  switch(action) {
  case '\a':
    zName = "RESTRICT";
    break;
  case '\b':
    zName = "SET NULL";
    break;
  case '\t':
    zName = "SET DEFAULT";
    break;
  case '\n':
    zName = "CASCADE";
    break;
  default:
    zName = "NO ACTION";
  }
  return zName;
}

Assistant:

static const char *actionName(u8 action){
  const char *zName;
  switch( action ){
    case OE_SetNull:  zName = "SET NULL";        break;
    case OE_SetDflt:  zName = "SET DEFAULT";     break;
    case OE_Cascade:  zName = "CASCADE";         break;
    case OE_Restrict: zName = "RESTRICT";        break;
    default:          zName = "NO ACTION";
                      assert( action==OE_None ); break;
  }
  return zName;
}